

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O0

aphy_transform * __thiscall
APhyBullet::BulletCollisionObject::getTransform(BulletCollisionObject *this)

{
  long in_RSI;
  btTransform *in_RDI;
  
  btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RSI + 0x10));
  convertTransform(in_RDI);
  return (aphy_transform *)in_RDI;
}

Assistant:

aphy_transform BulletCollisionObject::getTransform()
{
    return convertTransform(handle->getWorldTransform());
}